

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O1

void __thiscall
yactfr::internal::PseudoDst::PseudoDst
          (PseudoDst *this,TypeId id,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ns,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *name,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *uid,Up *pseudoPktCtxType,Up *pseudoErHeaderType,Up *pseudoErCommonCtxType,
          ClockType *defClkType,Up *attrs)

{
  undefined8 *puVar1;
  type tVar2;
  _Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_> _Var3;
  type tVar4;
  undefined8 uVar5;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_38;
  
  _Var3.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (_Head_base<0UL,_const_yactfr::MapItem_*,_false>)
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  (this->super_WithAttrsMixin)._attrs._M_t.
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false> =
       _Var3.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  local_38._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (_Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_38);
  this->_id = id;
  (this->_ns).super_type.m_initialized = false;
  if ((ns->super_type).m_initialized == true) {
    puVar1 = (undefined8 *)((long)&(this->_ns).super_type.m_storage.dummy_ + 0x10);
    *(undefined8 **)&(this->_ns).super_type.m_storage.dummy_ = puVar1;
    tVar4 = (ns->super_type).m_storage.dummy_.aligner_;
    tVar2 = (type)((long)&(ns->super_type).m_storage.dummy_ + 0x10);
    if (tVar4 == tVar2) {
      uVar5 = *(undefined8 *)((long)&(ns->super_type).m_storage.dummy_ + 0x18);
      *puVar1 = *(undefined8 *)tVar2;
      *(undefined8 *)((long)&(this->_ns).super_type.m_storage.dummy_ + 0x18) = uVar5;
    }
    else {
      (this->_ns).super_type.m_storage.dummy_.aligner_ = tVar4;
      *(undefined8 *)((long)&(this->_ns).super_type.m_storage.dummy_ + 0x10) = *(undefined8 *)tVar2;
    }
    *(undefined8 *)((long)&(this->_ns).super_type.m_storage.dummy_ + 8) =
         *(undefined8 *)((long)&(ns->super_type).m_storage.dummy_ + 8);
    *(type *)&(ns->super_type).m_storage.dummy_ = tVar2;
    *(undefined8 *)((long)&(ns->super_type).m_storage.dummy_ + 8) = 0;
    (ns->super_type).m_storage.dummy_.data[0x10] = '\0';
    (this->_ns).super_type.m_initialized = true;
  }
  (this->_name).super_type.m_initialized = false;
  if ((name->super_type).m_initialized == true) {
    puVar1 = (undefined8 *)((long)&(this->_name).super_type.m_storage.dummy_ + 0x10);
    *(undefined8 **)&(this->_name).super_type.m_storage.dummy_ = puVar1;
    tVar4 = (name->super_type).m_storage.dummy_.aligner_;
    tVar2 = (type)((long)&(name->super_type).m_storage.dummy_ + 0x10);
    if (tVar4 == tVar2) {
      uVar5 = *(undefined8 *)((long)&(name->super_type).m_storage.dummy_ + 0x18);
      *puVar1 = *(undefined8 *)tVar2;
      *(undefined8 *)((long)&(this->_name).super_type.m_storage.dummy_ + 0x18) = uVar5;
    }
    else {
      (this->_name).super_type.m_storage.dummy_.aligner_ = tVar4;
      *(undefined8 *)((long)&(this->_name).super_type.m_storage.dummy_ + 0x10) =
           *(undefined8 *)tVar2;
    }
    *(undefined8 *)((long)&(this->_name).super_type.m_storage.dummy_ + 8) =
         *(undefined8 *)((long)&(name->super_type).m_storage.dummy_ + 8);
    *(type *)&(name->super_type).m_storage.dummy_ = tVar2;
    *(undefined8 *)((long)&(name->super_type).m_storage.dummy_ + 8) = 0;
    (name->super_type).m_storage.dummy_.data[0x10] = '\0';
    (this->_name).super_type.m_initialized = true;
  }
  (this->_uid).super_type.m_initialized = false;
  if ((uid->super_type).m_initialized == true) {
    puVar1 = (undefined8 *)((long)&(this->_uid).super_type.m_storage.dummy_ + 0x10);
    *(undefined8 **)&(this->_uid).super_type.m_storage.dummy_ = puVar1;
    tVar4 = (uid->super_type).m_storage.dummy_.aligner_;
    tVar2 = (type)((long)&(uid->super_type).m_storage.dummy_ + 0x10);
    if (tVar4 == tVar2) {
      uVar5 = *(undefined8 *)((long)&(uid->super_type).m_storage.dummy_ + 0x18);
      *puVar1 = *(undefined8 *)tVar2;
      *(undefined8 *)((long)&(this->_uid).super_type.m_storage.dummy_ + 0x18) = uVar5;
    }
    else {
      (this->_uid).super_type.m_storage.dummy_.aligner_ = tVar4;
      *(undefined8 *)((long)&(this->_uid).super_type.m_storage.dummy_ + 0x10) = *(undefined8 *)tVar2
      ;
    }
    *(undefined8 *)((long)&(this->_uid).super_type.m_storage.dummy_ + 8) =
         *(undefined8 *)((long)&(uid->super_type).m_storage.dummy_ + 8);
    *(type *)&(uid->super_type).m_storage.dummy_ = tVar2;
    *(undefined8 *)((long)&(uid->super_type).m_storage.dummy_ + 8) = 0;
    (uid->super_type).m_storage.dummy_.data[0x10] = '\0';
    (this->_uid).super_type.m_initialized = true;
  }
  (this->_pseudoPktCtxType)._M_t.
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl =
       (pseudoPktCtxType->_M_t).
       super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
       ._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
       .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  (pseudoPktCtxType->_M_t).
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl = (PseudoDt *)0x0;
  (this->_pseudoErHeaderType)._M_t.
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl =
       (pseudoErHeaderType->_M_t).
       super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
       ._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
       .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  (pseudoErHeaderType->_M_t).
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl = (PseudoDt *)0x0;
  (this->_pseudoErCommonCtxType)._M_t.
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl =
       (pseudoErCommonCtxType->_M_t).
       super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
       ._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
       .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  (pseudoErCommonCtxType->_M_t).
  super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
  ._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl = (PseudoDt *)0x0;
  this->_defClkType = defClkType;
  return;
}

Assistant:

PseudoDst::PseudoDst(const TypeId id, boost::optional<std::string> ns,
                     boost::optional<std::string> name, boost::optional<std::string> uid,
                     PseudoDt::Up pseudoPktCtxType, PseudoDt::Up pseudoErHeaderType,
                     PseudoDt::Up pseudoErCommonCtxType, const ClockType * const defClkType,
                     MapItem::Up attrs) :
    WithAttrsMixin {std::move(attrs)},
    _id {id},
    _ns {std::move(ns)},
    _name {std::move(name)},
    _uid {std::move(uid)},
    _pseudoPktCtxType {std::move(pseudoPktCtxType)},
    _pseudoErHeaderType {std::move(pseudoErHeaderType)},
    _pseudoErCommonCtxType {std::move(pseudoErCommonCtxType)},
    _defClkType {defClkType}
{
}